

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<crnlib::find_files::file_desc>::insert
          (vector<crnlib::find_files::file_desc> *this,uint index,file_desc *p,uint n)

{
  uint uVar1;
  uint local_54;
  file_desc *pfStack_50;
  uint i_1;
  file_desc *pDst;
  file_desc *pfStack_40;
  uint i;
  file_desc *pDst_1;
  file_desc *pSrc;
  uint num_to_move;
  uint orig_size;
  uint n_local;
  file_desc *p_local;
  uint index_local;
  vector<crnlib::find_files::file_desc> *this_local;
  
  if (n != 0) {
    uVar1 = this->m_size;
    resize(this,this->m_size + n,true);
    pfStack_40 = this->m_p + ((ulong)uVar1 - 1) + n;
    pDst_1 = this->m_p + ((ulong)uVar1 - 1);
    for (pDst._4_4_ = 0; pDst._4_4_ < uVar1 - index; pDst._4_4_ = pDst._4_4_ + 1) {
      find_files::file_desc::operator=(pfStack_40,pDst_1);
      pfStack_40 = pfStack_40 + -1;
      pDst_1 = pDst_1 + -1;
    }
    pfStack_50 = this->m_p + index;
    _orig_size = p;
    for (local_54 = 0; local_54 < n; local_54 = local_54 + 1) {
      find_files::file_desc::operator=(pfStack_50,_orig_size);
      pfStack_50 = pfStack_50 + 1;
      _orig_size = _orig_size + 1;
    }
  }
  return;
}

Assistant:

inline void insert(uint index, const T* p, uint n)
        {
            CRNLIB_ASSERT(index <= m_size);
            if (!n)
            {
                return;
            }

            const uint orig_size = m_size;
            resize(m_size + n, true);

            const uint num_to_move = orig_size - index;

            if (CRNLIB_IS_BITWISE_COPYABLE(T))
            {
                // This overwrites the destination object bits, but bitwise copyable means we don't need to worry about destruction.
                memmove(m_p + index + n, m_p + index, sizeof(T) * num_to_move);
            }
            else
            {
                const T* pSrc = m_p + orig_size - 1;
                T* pDst = const_cast<T*>(pSrc) + n;

                for (uint i = 0; i < num_to_move; i++)
                {
                    CRNLIB_ASSERT((pDst - m_p) < (int)m_size);
                    *pDst-- = *pSrc--;
                }
            }

            T* pDst = m_p + index;

            if (CRNLIB_IS_BITWISE_COPYABLE(T))
            {
                // This copies in the new bits, overwriting the existing objects, which is OK for copyable types that don't need destruction.
                memcpy(pDst, p, sizeof(T) * n);
            }
            else
            {
                for (uint i = 0; i < n; i++)
                {
                    CRNLIB_ASSERT((pDst - m_p) < (int)m_size);
                    *pDst++ = *p++;
                }
            }
        }